

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O0

bool M_SetJoystickConfigSection(IJoystickConfig *joy,bool create)

{
  FGameConfigFile *this;
  bool bVar1;
  char *name;
  FString local_28;
  FString local_20;
  FString id;
  bool create_local;
  IJoystickConfig *joy_local;
  
  id.Chars._7_1_ = create;
  FString::FString(&local_20,"Joy:");
  (*joy->_vptr_IJoystickConfig[0x12])(&local_28);
  FString::operator+=(&local_20,&local_28);
  FString::~FString(&local_28);
  this = GameConfig;
  name = FString::operator_cast_to_char_(&local_20);
  bVar1 = FConfigFile::SetSection(&this->super_FConfigFile,name,(bool)(id.Chars._7_1_ & 1));
  FString::~FString(&local_20);
  return bVar1;
}

Assistant:

static bool M_SetJoystickConfigSection(IJoystickConfig *joy, bool create)
{
	FString id = "Joy:";
	id += joy->GetIdentifier();
	return GameConfig->SetSection(id, create);
}